

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebraReasoning.cpp
# Opt level: O2

Clause * Inferences::replaceLit(Clause *c,Literal *a,Literal *b,Inference *inf)

{
  Literal **ppLVar1;
  Clause *pCVar2;
  uint uVar3;
  Literal *elem;
  uint uVar4;
  RStack<Literal_*> resLits;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_80;
  Inference *local_70;
  Inference local_68;
  
  local_70 = inf;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_80);
  uVar3 = *(uint *)&c->field_0x38 & 0xfffff;
  uVar4 = (uint)(uVar3 != 0);
  ppLVar1 = (Literal **)0x0;
  if (uVar3 != 0) {
    ppLVar1 = c->_literals;
  }
  while (ppLVar1 != (Literal **)0x0) {
    elem = *ppLVar1;
    if (*ppLVar1 == a) {
      elem = b;
    }
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)
               local_80._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,elem);
    ppLVar1 = c->_literals + (int)uVar4;
    if (uVar3 <= uVar4) {
      ppLVar1 = (Literal **)0x0;
    }
    uVar4 = uVar4 + (uVar4 < uVar3);
  }
  local_68._0_8_ = *(undefined8 *)local_70;
  local_68._8_4_ = *(undefined4 *)&local_70->field_0x8;
  local_68._age = local_70->_age;
  local_68._splits = local_70->_splits;
  local_68._ptr1 = local_70->_ptr1;
  local_68._ptr2 = local_70->_ptr2;
  local_68.th_ancestors = local_70->th_ancestors;
  local_68.all_ancestors = local_70->all_ancestors;
  pCVar2 = Kernel::Clause::fromStack
                     ((Stack<Kernel::Literal_*> *)
                      local_80._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                      &local_68);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_80);
  return pCVar2;
}

Assistant:

Clause* replaceLit(Clause *c, Literal *a, Literal *b, const Inference& inf)
  {
    RStack<Literal*> resLits;
    for (auto lit : c->iterLits()) {
      resLits->push(lit == a ? b : lit);
    }
    return Clause::fromStack(*resLits,inf);
  }